

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplescene.cpp
# Opt level: O3

void __thiscall graphics101::SimpleScene::loadScene(SimpleScene *this,string *scene_path)

{
  DrawablePtr *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Drawable *__ptr;
  _Head_base<0UL,_graphics101::Drawable_*,_false> _Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  ShaderProgram *pSVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  undefined8 uVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  GLint position_location;
  GLint normal_location;
  GLint texcoord_location;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *__to;
  char *__from;
  string local_e8;
  string local_c8;
  string local_a8;
  undefined8 local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  string local_70;
  string local_50;
  
  Drawable::makePtr();
  _Var5._M_p = local_e8._M_dataplus._M_p;
  this_00 = &this->m_drawable;
  local_e8._M_dataplus._M_p = (pointer)0x0;
  __ptr = (this->m_drawable)._M_t.
          super___uniq_ptr_impl<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>.
          _M_t.
          super__Tuple_impl<0UL,_graphics101::Drawable_*,_std::default_delete<graphics101::Drawable>_>
          .super__Head_base<0UL,_graphics101::Drawable_*,_false>._M_head_impl;
  (this->m_drawable)._M_t.
  super___uniq_ptr_impl<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>._M_t.
  super__Tuple_impl<0UL,_graphics101::Drawable_*,_std::default_delete<graphics101::Drawable>_>.
  super__Head_base<0UL,_graphics101::Drawable_*,_false>._M_head_impl = (Drawable *)_Var5._M_p;
  if (__ptr != (Drawable *)0x0) {
    std::default_delete<graphics101::Drawable>::operator()
              ((default_delete<graphics101::Drawable> *)this_00,__ptr);
    if ((Drawable *)local_e8._M_dataplus._M_p != (Drawable *)0x0) {
      std::default_delete<graphics101::Drawable>::operator()
                ((default_delete<graphics101::Drawable> *)&local_e8,
                 (Drawable *)local_e8._M_dataplus._M_p);
    }
  }
  ShaderProgram::makePtr();
  sVar6 = local_e8._M_string_length;
  _Var5._M_p = local_e8._M_dataplus._M_p;
  _Var2._M_head_impl =
       (this_00->_M_t).
       super___uniq_ptr_impl<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>.
       _M_t.
       super__Tuple_impl<0UL,_graphics101::Drawable_*,_std::default_delete<graphics101::Drawable>_>.
       super__Head_base<0UL,_graphics101::Drawable_*,_false>._M_head_impl;
  local_e8._M_dataplus._M_p = (pointer)0x0;
  local_e8._M_string_length = 0;
  _Var3._M_pi = ((_Var2._M_head_impl)->program).
                super___shared_ptr<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  *(pointer *)&(_Var2._M_head_impl)->program = _Var5._M_p;
  ((_Var2._M_head_impl)->program).
  super___shared_ptr<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6;
  if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length);
  }
  pSVar4 = *(ShaderProgram **)
            &((this_00->_M_t).
              super___uniq_ptr_impl<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>
              ._M_t.
              super__Tuple_impl<0UL,_graphics101::Drawable_*,_std::default_delete<graphics101::Drawable>_>
              .super__Head_base<0UL,_graphics101::Drawable_*,_false>._M_head_impl)->program;
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"simplest.vs","");
  pathRelativeToFile(&local_c8,&local_a8,scene_path);
  fileAsString(&local_e8,&local_c8);
  ShaderProgram::addShader(pSVar4,0x8b31,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  pSVar4 = *(ShaderProgram **)
            &((this_00->_M_t).
              super___uniq_ptr_impl<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>
              ._M_t.
              super__Tuple_impl<0UL,_graphics101::Drawable_*,_std::default_delete<graphics101::Drawable>_>
              .super__Head_base<0UL,_graphics101::Drawable_*,_false>._M_head_impl)->program;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"simplest.fs","");
  pathRelativeToFile(&local_c8,&local_a8,scene_path);
  fileAsString(&local_e8,&local_c8);
  __from = (char *)0x8b30;
  ShaderProgram::addShader(pSVar4,0x8b30,&local_e8);
  __to = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
    __to = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
    __to = extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
    __to = extraout_RDX_02;
  }
  ShaderProgram::link(*(ShaderProgram **)
                       &((this_00->_M_t).
                         super___uniq_ptr_impl<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_graphics101::Drawable_*,_std::default_delete<graphics101::Drawable>_>
                         .super__Head_base<0UL,_graphics101::Drawable_*,_false>._M_head_impl)->
                        program,__from,__to);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"triangle.obj","");
  pathRelativeToFile(&local_e8,&local_c8,scene_path);
  pSVar4 = *(ShaderProgram **)
            &((this_00->_M_t).
              super___uniq_ptr_impl<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>
              ._M_t.
              super__Tuple_impl<0UL,_graphics101::Drawable_*,_std::default_delete<graphics101::Drawable>_>
              .super__Head_base<0UL,_graphics101::Drawable_*,_false>._M_head_impl)->program;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"vPos","");
  position_location = ShaderProgram::getAttribLocation(pSVar4,&local_a8);
  pSVar4 = *(ShaderProgram **)
            &((this_00->_M_t).
              super___uniq_ptr_impl<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>
              ._M_t.
              super__Tuple_impl<0UL,_graphics101::Drawable_*,_std::default_delete<graphics101::Drawable>_>
              .super__Head_base<0UL,_graphics101::Drawable_*,_false>._M_head_impl)->program;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"vNormal","");
  normal_location = ShaderProgram::getAttribLocation(pSVar4,&local_70);
  pSVar4 = *(ShaderProgram **)
            &((this_00->_M_t).
              super___uniq_ptr_impl<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>
              ._M_t.
              super__Tuple_impl<0UL,_graphics101::Drawable_*,_std::default_delete<graphics101::Drawable>_>
              .super__Head_base<0UL,_graphics101::Drawable_*,_false>._M_head_impl)->program;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"vTexCoord","");
  texcoord_location = ShaderProgram::getAttribLocation(pSVar4,&local_50);
  vao::makeFromOBJPath
            ((vao *)&local_88,&local_e8,true,false,position_location,normal_location,
             texcoord_location);
  _Var8._M_pi = _Stack_80._M_pi;
  uVar7 = local_88;
  _Var2._M_head_impl =
       (this_00->_M_t).
       super___uniq_ptr_impl<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>.
       _M_t.
       super__Tuple_impl<0UL,_graphics101::Drawable_*,_std::default_delete<graphics101::Drawable>_>.
       super__Head_base<0UL,_graphics101::Drawable_*,_false>._M_head_impl;
  local_88 = 0;
  _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Var3._M_pi = ((_Var2._M_head_impl)->vao).
                super___shared_ptr<graphics101::VertexAndFaceArrays,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  ((_Var2._M_head_impl)->vao).
  super___shared_ptr<graphics101::VertexAndFaceArrays,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar7;
  ((_Var2._M_head_impl)->vao).
  super___shared_ptr<graphics101::VertexAndFaceArrays,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var8._M_pi;
  if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
    if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  (*gl3wProcs.ptr[0x35])(0x3f800000,0,0,0x3f800000);
  return;
}

Assistant:

void SimpleScene::loadScene( const std::string& scene_path ) {
    
    m_drawable = Drawable::makePtr();
    
    // Make a program.
    // Everyone else expects it to have been created so we can get binding locations.
    m_drawable->program = ShaderProgram::makePtr();
    m_drawable->program->addShader( GL_VERTEX_SHADER, fileAsString( pathRelativeToFile( "simplest.vs", scene_path ) ) );
    m_drawable->program->addShader( GL_FRAGMENT_SHADER, fileAsString( pathRelativeToFile( "simplest.fs", scene_path ) ) );
    m_drawable->program->link();
    
    // Demonstration of setting a uniform programmatically.
    // m_drawable->program->setUniform( "uColor", vec3( 1.0, 1.0, 0.0 ) );
    
    m_drawable->vao = vao::makeFromOBJPath(
        pathRelativeToFile( "triangle.obj", scene_path ),
        // Create normals if needed.
        true,
        // Don't normalize.
        false,
        m_drawable->program->getAttribLocation( "vPos" ),
        m_drawable->program->getAttribLocation( "vNormal" ),
        m_drawable->program->getAttribLocation( "vTexCoord" )
        );
    
    // Finally, set the background color.
    glClearColor( 1.0, 0.0, 0.0, 1.0 );
}